

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_utf8_trim_whitespaces_right(char *str)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  char *last;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = strlen(str);
  local_28 = str + (int)sVar3;
  do {
    iVar1 = str_utf8_decode(&local_28);
    iVar1 = str_utf8_is_whitespace(iVar1);
    if (iVar1 == 0) break;
    str[(int)sVar3] = '\0';
    uVar2 = str_utf8_rewind(str,(int)sVar3);
    sVar3 = (size_t)uVar2;
    local_28 = str + (int)uVar2;
  } while (uVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void str_utf8_trim_whitespaces_right(char *str)
{
	int cursor = str_length(str);
	const char *last = str + cursor;
	while(str_utf8_is_whitespace(str_utf8_decode(&last)))
	{
		str[cursor] = 0;
		cursor = str_utf8_rewind(str, cursor);
		last = str + cursor;
		if(cursor == 0)
		{
			break;
		}
	}
}